

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O3

void __thiscall
embree::avx::BVHNBuilderSAH<4,_embree::InstanceArrayPrimitive>::build
          (BVHNBuilderSAH<4,_embree::InstanceArrayPrimitive> *this)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  pointer ppTVar5;
  Device *pDVar6;
  Block *pBVar7;
  PrimRef *pPVar8;
  MemoryMonitorInterface *pMVar9;
  Geometry *pGVar10;
  Scene *pSVar11;
  GTypeMask GVar12;
  double dVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  long *plVar19;
  PrimRef *pPVar20;
  NodeRef root;
  uint uVar21;
  long *plVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ulong uVar24;
  BVH **ppBVar25;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *prims;
  __pointer_type pBVar26;
  pointer ppTVar27;
  ulong uVar28;
  ulong uVar29;
  size_t sVar30;
  BVH *pBVar31;
  size_t sVar32;
  double t0;
  undefined1 auVar33 [16];
  PrimInfo pinfo;
  string __str;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [3];
  long local_a8;
  long local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  if ((this->mesh != (Geometry *)0x0) && (this->mesh->numPrimitives != this->numPreviousPrimitives))
  {
    pBVar31 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar31->alloc);
    ppTVar27 = (pBVar31->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppTVar5 = (pBVar31->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar27 != ppTVar5) {
      do {
        FastAllocator::ThreadLocal2::unbind(*ppTVar27,&pBVar31->alloc);
        ppTVar27 = ppTVar27 + 1;
      } while (ppTVar27 != ppTVar5);
      ppTVar27 = (pBVar31->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar31->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar27) {
        (pBVar31->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar27;
      }
    }
    LOCK();
    (pBVar31->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar31->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar31->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar31->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar6 = (pBVar31->alloc).device;
      bVar4 = (pBVar31->alloc).useUSM;
      pBVar26 = (pBVar31->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar7 = pBVar26->next;
        FastAllocator::Block::clear_block(pBVar26,pDVar6,bVar4);
        pBVar26 = pBVar7;
      } while (pBVar7 != (Block *)0x0);
    }
    LOCK();
    (pBVar31->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar31->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar6 = (pBVar31->alloc).device;
      bVar4 = (pBVar31->alloc).useUSM;
      pBVar26 = (pBVar31->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar7 = pBVar26->next;
        FastAllocator::Block::clear_block(pBVar26,pDVar6,bVar4);
        pBVar26 = pBVar7;
      } while (pBVar7 != (Block *)0x0);
    }
    LOCK();
    (pBVar31->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar18 = -8;
    do {
      LOCK();
      (pBVar31->alloc).threadBlocks[lVar18]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar31->alloc).threadBlocks[lVar18 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0);
    sVar30 = (pBVar31->alloc).primrefarray.size_alloced;
    pPVar8 = (pBVar31->alloc).primrefarray.items;
    if (pPVar8 != (PrimRef *)0x0) {
      if (sVar30 << 5 < 0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,sVar30 << 5,(pBVar31->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar30 != 0) {
      pMVar9 = (pBVar31->alloc).primrefarray.alloc.device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar30 * -0x20,1);
    }
    (pBVar31->alloc).primrefarray.size_active = 0;
    (pBVar31->alloc).primrefarray.size_alloced = 0;
    (pBVar31->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  if ((this->settings).primrefarrayalloc != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x28);
  }
  pGVar10 = this->mesh;
  if (pGVar10 == (Geometry *)0x0) {
    pSVar11 = this->scene;
    GVar12 = this->gtype_;
    uVar21 = (uint)GVar12;
    if ((uVar21 >> 0x14 & 1) == 0) {
      sVar30 = 0;
    }
    else {
      sVar30 = (pSVar11->world).numTriangles;
    }
    if ((uVar21 >> 0x15 & 1) != 0) {
      sVar30 = sVar30 + (pSVar11->world).numQuads;
    }
    if ((GVar12 & MTY_CURVE2) != ~MTY_ALL) {
      sVar30 = sVar30 + (pSVar11->world).numLineSegments;
    }
    if ((GVar12 & MTY_CURVE4) != ~MTY_ALL) {
      sVar30 = sVar30 + (pSVar11->world).numBezierCurves;
    }
    if ((GVar12 & MTY_POINTS) != ~MTY_ALL) {
      sVar30 = sVar30 + (pSVar11->world).numPoints;
    }
    if ((uVar21 >> 0x17 & 1) != 0) {
      sVar30 = sVar30 + (pSVar11->world).numSubdivPatches;
    }
    if ((uVar21 >> 0x1d & 1) != 0) {
      sVar30 = sVar30 + (pSVar11->world).numUserGeometries;
    }
    if ((uVar21 >> 0x1e & 1) != 0) {
      sVar30 = sVar30 + (pSVar11->world).numInstancesCheap;
    }
    if ((int)uVar21 < 0) {
      sVar30 = sVar30 + (pSVar11->world).numInstancesExpensive;
    }
    if ((uVar21 >> 0x18 & 1) != 0) {
      sVar30 = sVar30 + (pSVar11->world).numInstanceArrays;
    }
    if ((uVar21 >> 0x16 & 1) != 0) {
      sVar30 = sVar30 + (pSVar11->world).numGrids;
    }
    this->numPreviousPrimitives = (uint)sVar30;
    if (sVar30 == 0) goto LAB_012b6204;
    pBVar31 = this->bvh;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct((ulong)local_98,'\x01');
    *local_98[0] = 0x34;
    plVar19 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1fb0eed);
    local_108 = &local_f8;
    plVar22 = plVar19 + 2;
    if ((long *)*plVar19 == plVar22) {
      local_f8 = *plVar22;
      lStack_f0 = plVar19[3];
    }
    else {
      local_f8 = *plVar22;
      local_108 = (long *)*plVar19;
    }
    local_100 = plVar19[1];
    *plVar19 = (long)plVar22;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_e8._0_8_ = local_d8;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 == paVar23) {
      local_d8[0]._0_8_ = paVar23->_M_allocated_capacity;
      local_d8[0]._8_8_ = plVar19[3];
    }
    else {
      local_d8[0]._0_8_ = paVar23->_M_allocated_capacity;
      local_e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar19;
    }
    local_e8._8_8_ = plVar19[1];
    *plVar19 = (long)paVar23;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
  }
  else {
    sVar30 = (size_t)pGVar10->numPrimitives;
    this->numPreviousPrimitives = pGVar10->numPrimitives;
    if (sVar30 == 0) {
LAB_012b6204:
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      sVar30 = (this->prims).size_alloced;
      pPVar8 = (this->prims).items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar30 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar30 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar30 != 0) {
        pMVar9 = (this->prims).alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar30 * -0x20,1);
      }
      (this->prims).size_active = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
      return;
    }
    pBVar31 = this->bvh;
    local_e8._0_8_ = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  }
  ppBVar25 = &this->bvh;
  t0 = BVHN<4>::preBuild(pBVar31,(string *)&local_e8.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ != local_d8) {
    operator_delete((void *)local_e8._0_8_);
  }
  if (pGVar10 == (Geometry *)0x0) {
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
  }
  if (this->primrefarrayalloc == true) {
    uVar24 = 0xffffffffffffffff;
    if (999999 < sVar30) {
      uVar24 = sVar30 / 1000;
    }
    (this->settings).primrefarrayalloc = uVar24;
  }
  if (this->mesh != (Geometry *)0x0) {
    ((*ppBVar25)->alloc).atype = EMBREE_OS_MALLOC;
  }
  auVar33._8_8_ = 0;
  auVar33._0_8_ = sVar30;
  auVar33 = vpunpckldq_avx(auVar33,_DAT_01f7bac0);
  auVar33 = vsubpd_avx(auVar33,_DAT_01f7bad0);
  dVar13 = (auVar33._0_8_ + auVar33._8_8_) * 1.2 * 8.0;
  uVar24 = (ulong)dVar13;
  sVar32 = ((long)(dVar13 - 9.223372036854776e+18) & (long)uVar24 >> 0x3f | uVar24) +
           (sVar30 * 0xe0 >> 4);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar32);
  sVar32 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,sVar30,sVar32);
  (this->settings).singleThreadThreshold = sVar32;
  uVar24 = (this->prims).size_alloced;
  uVar29 = uVar24;
  if ((uVar24 < sVar30) && (uVar29 = sVar30, uVar28 = uVar24, uVar24 != 0)) {
    do {
      uVar29 = uVar28 * 2 + (ulong)(uVar28 * 2 == 0);
      uVar28 = uVar29;
    } while (uVar29 < sVar30);
  }
  psVar1 = &(this->prims).size_active;
  if (sVar30 < (this->prims).size_active) {
    *psVar1 = sVar30;
  }
  prims = (EVP_PKEY_CTX *)&this->prims;
  if (uVar24 == uVar29) {
    *psVar1 = sVar30;
    goto LAB_012b6547;
  }
  pMVar9 = (this->prims).alloc.device;
  pPVar8 = (this->prims).items;
  uVar24 = uVar29 << 5;
  (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar24,0);
  if (uVar24 < 0x1c00000) {
    pPVar20 = (PrimRef *)alignedMalloc(uVar24,0x20);
  }
  else {
    pPVar20 = (PrimRef *)os_malloc(uVar24,&(this->prims).alloc.hugepages);
  }
  (this->prims).items = pPVar20;
  if ((this->prims).size_active == 0) {
    sVar32 = (this->prims).size_alloced;
    if (pPVar8 != (PrimRef *)0x0) goto LAB_012b64f2;
  }
  else {
    lVar18 = 0;
    uVar24 = 0;
    do {
      puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar18);
      uVar15 = puVar2[1];
      uVar16 = puVar2[2];
      uVar17 = puVar2[3];
      puVar3 = (undefined8 *)((long)&(((this->prims).items)->lower).field_0 + lVar18);
      *puVar3 = *puVar2;
      puVar3[1] = uVar15;
      puVar3[2] = uVar16;
      puVar3[3] = uVar17;
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 0x20;
    } while (uVar24 < (this->prims).size_active);
    sVar32 = (this->prims).size_alloced;
LAB_012b64f2:
    if (sVar32 << 5 < 0x1c00000) {
      alignedFree(pPVar8);
    }
    else {
      os_free(pPVar8,sVar32 << 5,(this->prims).alloc.hugepages);
    }
  }
  if (sVar32 != 0) {
    pMVar9 = (((mvector<PrimRef> *)prims)->alloc).device;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar32 * -0x20,1);
  }
  (this->prims).size_active = sVar30;
  (this->prims).size_alloced = uVar29;
LAB_012b6547:
  if (this->mesh == (Geometry *)0x0) {
    avx::createPrimRefArray
              ((PrimInfo *)&local_e8.field_1,this->scene,this->gtype_,false,sVar30,
               (mvector<PrimRef> *)prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  else {
    avx::createPrimRefArray
              ((PrimInfo *)&local_e8.field_1,this->mesh,this->geomID_,sVar30,
               (mvector<PrimRef> *)prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  local_78._8_8_ = this->bvh;
  if (local_a0 == local_a8) {
    (*(((BVH *)local_78._8_8_)->super_AccelData).super_RefCount._vptr_RefCount[5])();
    sVar30 = (this->prims).size_alloced;
    pPVar8 = (this->prims).items;
    if (pPVar8 != (PrimRef *)0x0) {
      if (sVar30 << 5 < 0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,sVar30 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar30 != 0) {
      pMVar9 = (((mvector<PrimRef> *)prims)->alloc).device;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar30 * -0x20,1);
    }
    *psVar1 = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  else {
    local_78._0_8_ = &PTR_createLeaf_02196928;
    root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                     ((BVHNBuilderV *)&local_78,&((BVH *)local_78._8_8_)->alloc,
                      &(((BVH *)local_78._8_8_)->scene->progressInterface).
                       super_BuildProgressMonitor,(this->prims).items,(PrimInfo *)&local_e8.field_1,
                      this->settings);
    local_78._0_8_ = local_e8._0_8_;
    local_78._8_8_ = local_e8._8_8_;
    local_68._0_8_ = local_d8[0]._M_allocated_capacity;
    local_68._8_8_ = local_d8[0]._8_8_;
    local_58._0_8_ = local_e8._0_8_;
    local_58._8_8_ = local_e8._8_8_;
    local_48._0_8_ = local_d8[0]._M_allocated_capacity;
    local_48._8_8_ = local_d8[0]._8_8_;
    BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78,local_a0 - local_a8);
    fVar14 = (float)(ulong)(local_a0 - local_a8) * 0.005;
    uVar24 = (ulong)fVar14;
    ctx = (EVP_PKEY_CTX *)((long)(fVar14 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24);
    BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
    if ((this->settings).primrefarrayalloc == 0xffffffffffffffff) {
      if ((this->scene != (Scene *)0x0) &&
         ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
        sVar30 = (this->prims).size_alloced;
        pPVar8 = (this->prims).items;
        if (pPVar8 != (PrimRef *)0x0) {
          ctx = (EVP_PKEY_CTX *)(sVar30 << 5);
          if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
            alignedFree(pPVar8);
          }
          else {
            os_free(pPVar8,(size_t)ctx,(this->prims).alloc.hugepages);
          }
        }
        if (sVar30 != 0) {
          pMVar9 = (((mvector<PrimRef> *)prims)->alloc).device;
          ctx = (EVP_PKEY_CTX *)(sVar30 * -0x20);
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,ctx,1);
        }
        *psVar1 = 0;
        (this->prims).size_alloced = 0;
        (this->prims).items = (PrimRef *)0x0;
      }
    }
    else {
      FastAllocator::share(&(*ppBVar25)->alloc,(mvector<PrimRef> *)prims);
      ctx = prims;
    }
    BVHN<4>::cleanup(*ppBVar25,ctx);
    BVHN<4>::postBuild(*ppBVar25,t0);
  }
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.unshare(prims);

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif

            /* create primref array */
            if (primrefarrayalloc) {
              settings.primrefarrayalloc = numPrimitives/1000;
              if (settings.primrefarrayalloc < 1000)
                settings.primrefarrayalloc = inf;
            }

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* initialize allocator */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::AABBNodeMB)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            prims.resize(numPrimitives);

            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
              createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* pinfo might has zero size due to invalid geometry */
            if (unlikely(pinfo.size() == 0))
            {
              bvh->clear();
              prims.clear();
              return;
            }

            /* call BVH builder */
            NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeaf<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

#if PROFILE
          });
#endif

        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.share(prims);

        /* for static geometries we can do some cleanups */
        else if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }